

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O1

void __thiscall xray_re::xr_object::xr_object(xr_object *this,xr_surface_factory *surface_factory)

{
  (this->super_xr_surface_factory)._vptr_xr_surface_factory = (_func_int **)&PTR__xr_object_00248ff0
  ;
  this->m_flags = 0;
  (this->m_userdata)._M_dataplus._M_p = (pointer)&(this->m_userdata).field_2;
  (this->m_userdata)._M_string_length = 0;
  (this->m_userdata).field_2._M_local_buf[0] = '\0';
  (this->m_lod_ref)._M_dataplus._M_p = (pointer)&(this->m_lod_ref).field_2;
  (this->m_lod_ref)._M_string_length = 0;
  (this->m_lod_ref).field_2._M_local_buf[0] = '\0';
  (this->m_surfaces).
  super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_surfaces).
  super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_surfaces).
  super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_meshes).super__Vector_base<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_meshes).super__Vector_base<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_meshes).super__Vector_base<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_bones).super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_bones).super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_bones).super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_motions).
  super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_motions).
  super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_motions).
  super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_motion_refs)._M_dataplus._M_p = (pointer)&(this->m_motion_refs).field_2;
  (this->m_motion_refs)._M_string_length = 0;
  (this->m_motion_refs).field_2._M_local_buf[0] = '\0';
  (this->m_partitions).
  super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_partitions).
  super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_partitions).
  super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_owner_name)._M_dataplus._M_p = (pointer)&(this->m_owner_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_owner_name,"unknown","");
  this->m_creation_time = 0;
  (this->m_modif_name)._M_dataplus._M_p = (pointer)&(this->m_modif_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_modif_name,"unknown","");
  this->m_modified_time = 0;
  this->m_surface_factory = surface_factory;
  (this->m_raw_surfaces)._M_h._M_buckets = &(this->m_raw_surfaces)._M_h._M_single_bucket;
  (this->m_raw_surfaces)._M_h._M_bucket_count = 1;
  (this->m_raw_surfaces)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_raw_surfaces)._M_h._M_element_count = 0;
  (this->m_raw_surfaces)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_raw_surfaces)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_raw_surfaces)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->m_position).field_0 = 0;
  *(undefined8 *)((long)&(this->m_position).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->m_rotation).field_0 + 4) = 0;
  return;
}

Assistant:

xr_object::xr_object(const xr_surface_factory* surface_factory):
	m_flags(EOF_STATIC),
	m_owner_name("unknown"), m_creation_time(0),
	m_modif_name("unknown"), m_modified_time(0),
	m_surface_factory(surface_factory)
{
	m_position.set();
	m_rotation.set();
}